

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

Expression * __thiscall rsg::TexLookup::createNextChild(TexLookup *this,GeneratorState *state)

{
  ConstValueRangeAccess valueRange;
  ConstValueRangeAccess valueRange_00;
  ConstValueRangeAccess valueRange_01;
  ValueRangeAccess valueRange_02;
  ValueRangeAccess valueRange_03;
  Expression *pEVar1;
  Random *pRVar2;
  ConstStridedValueAccess<1> CVar3;
  Scalar *in_stack_fffffffffffffa30;
  float local_594;
  float local_560;
  bool local_541;
  float local_4c4;
  float local_490;
  bool local_451;
  ValueRangeAccess local_450;
  VariableType *local_438;
  Scalar *pSStack_430;
  Scalar *local_428;
  ConstStridedValueAccess<1> local_418;
  ConstStridedValueAccess<1> local_408;
  ConstStridedValueAccess<1> local_3f8;
  ConstStridedValueAccess<1> local_3e8;
  byte local_3d1;
  undefined1 auStack_3d0 [7];
  bool neg_1;
  Scalar *pSStack_3c8;
  Scalar *local_3c0;
  VariableType local_3b8;
  undefined1 local_368 [8];
  ValueRange coordRange_1;
  int coordScalarSize;
  bool isProj;
  Scalar *pSStack_2d8;
  Scalar *local_2d0;
  VariableType *local_2c8;
  Scalar *pSStack_2c0;
  Scalar *local_2b8;
  ConstStridedValueAccess<1> local_2b0;
  ConstStridedValueAccess<1> local_2a0;
  ConstStridedValueAccess<1> local_290;
  ConstStridedValueAccess<1> local_280;
  ConstStridedValueAccess<1> local_270;
  ConstStridedValueAccess<1> local_260;
  ConstStridedValueAccess<1> local_250;
  ConstStridedValueAccess<1> local_240;
  byte local_22d;
  int local_22c;
  undefined1 local_228 [3];
  bool neg;
  int ndx;
  undefined1 local_1d8 [8];
  ValueRange coordRange;
  undefined1 auStack_150 [4];
  int majorAxisNdx;
  Scalar *pSStack_148;
  Scalar *local_140;
  VariableType *local_138;
  Scalar *pSStack_130;
  Scalar *local_128;
  ValueRangeAccess local_120;
  VariableType local_f8;
  undefined1 local_a8 [8];
  ValueRange lodRange;
  bool hasLodBias;
  GeneratorState *state_local;
  TexLookup *this_local;
  
  local_451 = true;
  if ((this->m_type != TYPE_TEXTURE2D_LOD) &&
     (local_451 = true, this->m_type != TYPE_TEXTURE2D_PROJ_LOD)) {
    local_451 = this->m_type == TYPE_TEXTURECUBE_LOD;
  }
  lodRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = local_451;
  if ((local_451 == false) || (this->m_lodBiasExpr != (Expression *)0x0)) {
    if (this->m_coordExpr == (Expression *)0x0) {
      if ((this->m_type == TYPE_TEXTURECUBE) || (this->m_type == TYPE_TEXTURECUBE_LOD)) {
        pRVar2 = GeneratorState::getRandom(state);
        coordRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = de::Random::getInt(pRVar2,0,2);
        VariableType::VariableType((VariableType *)local_228,TYPE_FLOAT,3);
        ValueRange::ValueRange((ValueRange *)local_1d8,(VariableType *)local_228);
        VariableType::~VariableType((VariableType *)local_228);
        for (local_22c = 0; local_22c < 3; local_22c = local_22c + 1) {
          if (local_22c ==
              coordRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage._4_4_) {
            pRVar2 = GeneratorState::getRandom(state);
            local_22d = de::Random::getBool(pRVar2);
            local_490 = -4.0;
            if (!(bool)local_22d) {
              local_490 = 2.25;
            }
            CVar3 = (ConstStridedValueAccess<1>)ValueRange::getMin((ValueRange *)local_1d8);
            local_250 = CVar3;
            CVar3 = (ConstStridedValueAccess<1>)
                    StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_250,local_22c);
            local_240 = CVar3;
            StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_240,local_490);
            local_4c4 = -2.25;
            if ((local_22d & 1) == 0) {
              local_4c4 = 4.0;
            }
            CVar3 = (ConstStridedValueAccess<1>)ValueRange::getMax((ValueRange *)local_1d8);
            local_270 = CVar3;
            CVar3 = (ConstStridedValueAccess<1>)
                    StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_270,local_22c);
            local_260 = CVar3;
            StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_260,local_4c4);
          }
          else {
            CVar3 = (ConstStridedValueAccess<1>)ValueRange::getMin((ValueRange *)local_1d8);
            local_290 = CVar3;
            CVar3 = (ConstStridedValueAccess<1>)
                    StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_290,local_22c);
            local_280 = CVar3;
            StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_280,-2.0);
            CVar3 = (ConstStridedValueAccess<1>)ValueRange::getMax((ValueRange *)local_1d8);
            local_2b0 = CVar3;
            CVar3 = (ConstStridedValueAccess<1>)
                    StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_2b0,local_22c);
            local_2a0 = CVar3;
            StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_2a0,2.0);
          }
        }
        ValueRange::asAccess((ValueRangeAccess *)&coordScalarSize,(ValueRange *)local_1d8);
        local_2b8 = local_2d0;
        local_2c8 = _coordScalarSize;
        pSStack_2c0 = pSStack_2d8;
        valueRange_00.m_min = pSStack_2d8;
        valueRange_00.m_type = _coordScalarSize;
        valueRange_00.m_max = local_2d0;
        pEVar1 = Expression::createRandom(state,valueRange_00);
        this->m_coordExpr = pEVar1;
        ValueRange::~ValueRange((ValueRange *)local_1d8);
      }
      else {
        local_541 = true;
        if (this->m_type != TYPE_TEXTURE2D_PROJ) {
          local_541 = this->m_type == TYPE_TEXTURE2D_PROJ_LOD;
        }
        coordRange_1.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = local_541;
        coordRange_1.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = local_541 | 2;
        VariableType::VariableType
                  (&local_3b8,TYPE_FLOAT,
                   (uint)coordRange_1.m_max.
                         super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        ValueRange::ValueRange((ValueRange *)local_368,&local_3b8);
        VariableType::~VariableType(&local_3b8);
        ValueRange::operator_cast_to_ValueRangeAccess
                  ((ValueRangeAccess *)auStack_3d0,(ValueRange *)local_368);
        valueRange_03.super_ConstValueRangeAccess.m_min = local_3c0;
        valueRange_03.super_ConstValueRangeAccess.m_type = (VariableType *)pSStack_3c8;
        valueRange_03.super_ConstValueRangeAccess.m_max = in_stack_fffffffffffffa30;
        anon_unknown_0::setInfiniteRange(valueRange_03);
        if ((coordRange_1.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
          pRVar2 = GeneratorState::getRandom(state);
          local_3d1 = de::Random::getBool(pRVar2);
          local_560 = -4.0;
          if (!(bool)local_3d1) {
            local_560 = 0.25;
          }
          local_3f8 = (ConstStridedValueAccess<1>)ValueRange::getMin((ValueRange *)local_368);
          local_3e8 = (ConstStridedValueAccess<1>)
                      StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_3f8,2);
          StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_3e8,local_560);
          local_594 = -0.25;
          if ((local_3d1 & 1) == 0) {
            local_594 = 4.0;
          }
          local_418 = (ConstStridedValueAccess<1>)ValueRange::getMax((ValueRange *)local_368);
          local_408 = (ConstStridedValueAccess<1>)
                      StridedValueAccess<1>::component((StridedValueAccess<1> *)&local_418,2);
          StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_408,local_594);
        }
        ValueRange::asAccess(&local_450,(ValueRange *)local_368);
        local_428 = local_450.super_ConstValueRangeAccess.m_max;
        local_438 = local_450.super_ConstValueRangeAccess.m_type;
        pSStack_430 = local_450.super_ConstValueRangeAccess.m_min;
        valueRange_01.m_min = local_450.super_ConstValueRangeAccess.m_min;
        valueRange_01.m_type = local_450.super_ConstValueRangeAccess.m_type;
        valueRange_01.m_max = local_450.super_ConstValueRangeAccess.m_max;
        pEVar1 = Expression::createRandom(state,valueRange_01);
        this->m_coordExpr = pEVar1;
        ValueRange::~ValueRange((ValueRange *)local_368);
      }
      this_local = (TexLookup *)this->m_coordExpr;
    }
    else {
      this_local = (TexLookup *)0x0;
    }
  }
  else {
    VariableType::VariableType(&local_f8,TYPE_FLOAT,1);
    ValueRange::ValueRange((ValueRange *)local_a8,&local_f8);
    VariableType::~VariableType(&local_f8);
    ValueRange::operator_cast_to_ValueRangeAccess(&local_120,(ValueRange *)local_a8);
    valueRange_02.super_ConstValueRangeAccess.m_min = local_120.super_ConstValueRangeAccess.m_max;
    valueRange_02.super_ConstValueRangeAccess.m_type =
         (VariableType *)local_120.super_ConstValueRangeAccess.m_min;
    valueRange_02.super_ConstValueRangeAccess.m_max = in_stack_fffffffffffffa30;
    anon_unknown_0::setInfiniteRange(valueRange_02);
    ValueRange::asAccess((ValueRangeAccess *)auStack_150,(ValueRange *)local_a8);
    local_128 = local_140;
    local_138 = _auStack_150;
    pSStack_130 = pSStack_148;
    valueRange.m_min = pSStack_148;
    valueRange.m_type = _auStack_150;
    valueRange.m_max = local_140;
    pEVar1 = Expression::createRandom(state,valueRange);
    this->m_lodBiasExpr = pEVar1;
    this_local = (TexLookup *)this->m_lodBiasExpr;
    ValueRange::~ValueRange((ValueRange *)local_a8);
  }
  return &this_local->super_Expression;
}

Assistant:

Expression* TexLookup::createNextChild (GeneratorState& state)
{
	bool hasLodBias		= m_type == TYPE_TEXTURE2D_LOD ||
						  m_type == TYPE_TEXTURE2D_PROJ_LOD ||
						  m_type == TYPE_TEXTURECUBE_LOD;

	if (hasLodBias && !m_lodBiasExpr)
	{
		ValueRange lodRange(VariableType(VariableType::TYPE_FLOAT, 1));
		setInfiniteRange(lodRange); // Any value is valid.

		m_lodBiasExpr = Expression::createRandom(state, lodRange.asAccess());
		return m_lodBiasExpr;
	}

	if (!m_coordExpr)
	{
		if (m_type == TYPE_TEXTURECUBE || m_type == TYPE_TEXTURECUBE_LOD)
		{
			// Make sure major axis selection can be done.
			int majorAxisNdx = state.getRandom().getInt(0, 2);

			ValueRange coordRange(VariableType(VariableType::TYPE_FLOAT, 3));

			for (int ndx = 0; ndx < 3; ndx++)
			{
				if (ndx == majorAxisNdx)
				{
					bool neg = state.getRandom().getBool();
					coordRange.getMin().component(ndx) = neg ? -4.0f	: 2.25f;
					coordRange.getMax().component(ndx) = neg ? -2.25f	: 4.0f;
				}
				else
				{
					coordRange.getMin().component(ndx) = -2.0f;
					coordRange.getMax().component(ndx) =  2.0f;
				}
			}

			m_coordExpr = Expression::createRandom(state, coordRange.asAccess());
		}
		else
		{
			bool	isProj				= m_type == TYPE_TEXTURE2D_PROJ || m_type == TYPE_TEXTURE2D_PROJ_LOD;
			int		coordScalarSize		= isProj ? 3 : 2;

			ValueRange coordRange(VariableType(VariableType::TYPE_FLOAT, coordScalarSize));
			setInfiniteRange(coordRange); // Initialize base range with -inf..inf

			if (isProj)
			{
				// w coordinate must be something sane, and not 0.
				bool neg = state.getRandom().getBool();
				coordRange.getMin().component(2) = neg ? -4.0f  : 0.25f;
				coordRange.getMax().component(2) = neg ? -0.25f : 4.0f;
			}

			m_coordExpr = Expression::createRandom(state, coordRange.asAccess());
		}

		DE_ASSERT(m_coordExpr);
		return m_coordExpr;
	}

	return DE_NULL; // Done.
}